

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squtils.h
# Opt level: O2

void __thiscall
sqvector<long_long>::resize(sqvector<long_long> *this,SQUnsignedInteger newsize,longlong *fill)

{
  longlong *plVar1;
  ulong uVar2;
  
  if (this->_allocated < newsize) {
    _realloc(this,newsize);
  }
  uVar2 = this->_size;
  if (uVar2 < newsize) {
    plVar1 = this->_vals;
    while (uVar2 < newsize) {
      plVar1[uVar2] = *fill;
      uVar2 = this->_size + 1;
      this->_size = uVar2;
    }
  }
  else {
    this->_size = newsize;
  }
  return;
}

Assistant:

void resize(SQUnsignedInteger newsize, const T& fill = T())
    {
        if(newsize > _allocated)
            _realloc(newsize);
        if(newsize > _size) {
            while(_size < newsize) {
                new ((void *)&_vals[_size]) T(fill);
                _size++;
            }
        }
        else{
            for(SQUnsignedInteger i = newsize; i < _size; i++) {
                _vals[i].~T();
            }
            _size = newsize;
        }
    }